

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_ARB1_BREAK(Context *ctx)

{
  int iVar1;
  char local_38 [8];
  char failbranch [32];
  int faillabel;
  Context *ctx_local;
  
  if ((ctx->profile_supports_nv4 == 0) &&
     ((ctx->profile_supports_nv2 == 0 || (iVar1 = shader_is_pixel(ctx), iVar1 == 0)))) {
    if (ctx->profile_supports_nv2 == 0) {
      failf(ctx,"branching unsupported in %s profile",ctx->profile->name);
    }
    else {
      if (ctx->branch_labels_stack_index < 2) {
        __assert_fail("ctx->branch_labels_stack_index >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                      ,0x1f04,"void emit_ARB1_BREAK(Context *)");
      }
      failbranch._28_4_ = ctx->branch_labels_stack[ctx->branch_labels_stack_index];
      get_ARB1_branch_label_name(ctx,failbranch._28_4_,local_38,0x20);
      output_line(ctx,"BRA %s;",local_38);
    }
  }
  else {
    output_line(ctx,"BRK;");
  }
  return;
}

Assistant:

static void emit_ARB1_BREAK(Context *ctx)
{
    // nv2 fragment programs (and everything nv4) have a real BREAK.
    if ( (support_nv4(ctx)) || ((support_nv2(ctx)) && (shader_is_pixel(ctx))) )
        output_line(ctx, "BRK;");

    else if (support_nv2(ctx))
    {
        // no BREAK, but we can use branches.
        assert(ctx->branch_labels_stack_index >= 2);
        const int faillabel = ctx->branch_labels_stack[ctx->branch_labels_stack_index];
        char failbranch[32];
        get_ARB1_branch_label_name(ctx,faillabel,failbranch,sizeof(failbranch));
        output_line(ctx, "BRA %s;", failbranch);
    } // else if

    else  // stock ARB1 has no branching.
    {
        failf(ctx, "branching unsupported in %s profile", ctx->profile->name);
    } // else
}